

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool __thiscall DynamicProfileStorage::StorageInfo::WriteRecord(StorageInfo *this,char *record)

{
  bool bVar1;
  DWORD DVar2;
  char *t;
  undefined1 local_240 [8];
  DynamicProfileStorageReaderWriter writer;
  char16 cacheFilename [260];
  char *record_local;
  StorageInfo *this_local;
  
  GetFilename(this,(char16 *)&writer.deleteNonClosed);
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_240);
  bVar1 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)local_240,
                     (char16 *)&writer.deleteNonClosed,L"wcb",true,(errno_t *)0x0);
  if (bVar1) {
    t = GetRecordBuffer(record);
    DVar2 = GetRecordSize(record);
    bVar1 = DynamicProfileStorageReaderWriter::WriteArray<char_const>
                      ((DynamicProfileStorageReaderWriter *)local_240,t,(ulong)DVar2);
    if (bVar1) {
      DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)local_240,false)
      ;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    Output::Print(L"ERROR: DynamicProfileStorage: Unable open record file \'%s\'",
                  &writer.deleteNonClosed);
    Output::Flush();
    this_local._7_1_ = false;
  }
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_240);
  return this_local._7_1_;
}

Assistant:

bool DynamicProfileStorage::StorageInfo::WriteRecord(__in_ecount(sizeof(DWORD) + *record)char const * record) const
{
    char16 cacheFilename[_MAX_PATH];
    this->GetFilename(cacheFilename);
    DynamicProfileStorageReaderWriter writer;
    if (!writer.Init(cacheFilename, _u("wcb"), true))
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable open record file '%s'"), cacheFilename);
        Output::Flush();
        return false;
    }
    if (!writer.WriteArray(GetRecordBuffer(record), GetRecordSize(record)))
    {
        return false;
    }
    // Success
    writer.Close();
    return true;
}